

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O1

MontgomeryCurve * mcurve(void)

{
  mp_int *p;
  mp_int *a;
  mp_int *b;
  MontgomeryCurve *pMVar1;
  
  p = mp_from_hex("de978eb1db35236a5792e9f0c04d86000659");
  a = mp_from_hex("799b62a612b1b30e1c23cea6d67b2e33c51a");
  b = mp_from_hex("944bf9042b56821a8c9e0b49b636c2502b2b");
  pMVar1 = ecc_montgomery_curve(p,a,b);
  mp_free(p);
  mp_free(a);
  mp_free(b);
  return pMVar1;
}

Assistant:

static MontgomeryCurve *mcurve(void)
{
    mp_int *p = MP_LITERAL(0xde978eb1db35236a5792e9f0c04d86000659);
    mp_int *a = MP_LITERAL(0x799b62a612b1b30e1c23cea6d67b2e33c51a);
    mp_int *b = MP_LITERAL(0x944bf9042b56821a8c9e0b49b636c2502b2b);
    MontgomeryCurve *mc = ecc_montgomery_curve(p, a, b);
    mp_free(p);
    mp_free(a);
    mp_free(b);
    return mc;
}